

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# debug.h
# Opt level: O3

String * __thiscall
kj::_::Debug::makeDescription<char_const(&)[24],unsigned_long&,unsigned_short&>
          (String *__return_storage_ptr__,Debug *this,char *macroArgs,char (*params) [24],
          unsigned_long *params_1,unsigned_short *params_2)

{
  long lVar1;
  undefined8 uVar2;
  undefined8 *puVar3;
  unsigned_long *params_00;
  unsigned_short *params_01;
  unsigned_long *puVar4;
  long lVar5;
  ArrayPtr<kj::String> argValues_00;
  String argValues [3];
  String SStack_78;
  String local_60;
  String local_48;
  
  puVar4 = params_1;
  str<char_const(&)[24]>(&SStack_78,(kj *)macroArgs,(char (*) [24])macroArgs);
  str<unsigned_long&>(&local_60,(kj *)params,params_00);
  str<unsigned_short&>(&local_48,(kj *)params_1,params_01);
  argValues_00.size_ = (size_t)puVar4;
  argValues_00.ptr = (String *)0x3;
  makeDescriptionInternal(__return_storage_ptr__,this,(char *)&SStack_78,argValues_00);
  lVar5 = 0x30;
  do {
    lVar1 = *(long *)((long)&SStack_78.content.ptr + lVar5);
    if (lVar1 != 0) {
      uVar2 = *(undefined8 *)((long)&SStack_78.content.size_ + lVar5);
      *(undefined8 *)((long)&SStack_78.content.ptr + lVar5) = 0;
      *(undefined8 *)((long)&SStack_78.content.size_ + lVar5) = 0;
      puVar3 = *(undefined8 **)((long)&SStack_78.content.disposer + lVar5);
      (**(code **)*puVar3)(puVar3,lVar1,1,uVar2,uVar2,0);
    }
    lVar5 = lVar5 + -0x18;
  } while (lVar5 != -0x18);
  return __return_storage_ptr__;
}

Assistant:

String Debug::makeDescription(const char* macroArgs, Params&&... params) {
  String argValues[sizeof...(Params)] = {str(params)...};
  return makeDescriptionInternal(macroArgs, arrayPtr(argValues, sizeof...(Params)));
}